

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synced_bcf_reader.c
# Opt level: O0

int bcf_sr_regions_overlap(bcf_sr_regions_t *reg,char *seq,int start,int end)

{
  bool bVar1;
  int iVar2;
  int local_2c;
  int local_28;
  int iseq;
  int end_local;
  int start_local;
  char *seq_local;
  bcf_sr_regions_t *reg_local;
  
  local_28 = end;
  iseq = start;
  _end_local = seq;
  seq_local = (char *)reg;
  iVar2 = khash_str2int_get(reg->seq_hash,seq,&local_2c);
  if (iVar2 < 0) {
    reg_local._4_4_ = -1;
  }
  else {
    if (((*(int *)(seq_local + 0xa8) == -1) || (local_2c != *(int *)(seq_local + 0xa8))) ||
       (iseq < *(int *)(seq_local + 0xac))) {
      if (((*(long *)(seq_local + 0x70) != 0) && (*(int *)(seq_local + 0xa8) != -1)) &&
         (*(int *)(seq_local + 0x9c) != -1)) {
        bcf_sr_regions_flush((bcf_sr_regions_t *)seq_local);
      }
      bcf_sr_regions_seek((bcf_sr_regions_t *)seq_local,_end_local);
      seq_local[0xa4] = -1;
      seq_local[0xa5] = -1;
      seq_local[0xa6] = -1;
      seq_local[0xa7] = -1;
      seq_local[0xa0] = -1;
      seq_local[0xa1] = -1;
      seq_local[0xa2] = -1;
      seq_local[0xa3] = -1;
    }
    if ((*(int *)(seq_local + 0xa8) == local_2c) && (*(int *)(seq_local + 0x9c) != local_2c)) {
      reg_local._4_4_ = -2;
    }
    else {
      *(undefined4 *)(seq_local + 0xa8) = *(undefined4 *)(seq_local + 0x9c);
      *(int *)(seq_local + 0xac) = iseq;
      while( true ) {
        bVar1 = false;
        if (local_2c == *(int *)(seq_local + 0x9c)) {
          bVar1 = *(int *)(seq_local + 0xa4) < iseq;
        }
        if (!bVar1) {
          if (*(int *)(seq_local + 0xa0) <= local_28) {
            return 0;
          }
          return -1;
        }
        iVar2 = bcf_sr_regions_next((bcf_sr_regions_t *)seq_local);
        if (iVar2 < 0) {
          return -2;
        }
        if (*(int *)(seq_local + 0x9c) != local_2c) break;
        if ((*(long *)(seq_local + 0x70) != 0) && (*(int *)(seq_local + 0xa4) < iseq)) {
          (**(code **)(seq_local + 0x70))(seq_local,*(undefined8 *)(seq_local + 0x78));
        }
      }
      reg_local._4_4_ = -1;
    }
  }
  return reg_local._4_4_;
}

Assistant:

int bcf_sr_regions_overlap(bcf_sr_regions_t *reg, const char *seq, int start, int end)
{
    int iseq;
    if ( khash_str2int_get(reg->seq_hash, seq, &iseq)<0 ) return -1;    // no such sequence

    if ( reg->prev_seq==-1 || iseq!=reg->prev_seq || reg->prev_start > start ) // new chromosome or after a seek
    {
        // flush regions left on previous chromosome
        if ( reg->missed_reg_handler && reg->prev_seq!=-1 && reg->iseq!=-1 )
            bcf_sr_regions_flush(reg);

        bcf_sr_regions_seek(reg, seq);
        reg->start = reg->end = -1;
    }
    if ( reg->prev_seq==iseq && reg->iseq!=iseq ) return -2;    // no more regions on this chromosome
    reg->prev_seq = reg->iseq;
    reg->prev_start = start;

    while ( iseq==reg->iseq && reg->end < start )
    {
        if ( bcf_sr_regions_next(reg) < 0 ) return -2;  // no more regions left
        if ( reg->iseq != iseq ) return -1; // does not overlap any regions
        if ( reg->missed_reg_handler && reg->end < start ) reg->missed_reg_handler(reg, reg->missed_reg_data);
    }
    if ( reg->start <= end ) return 0;    // region overlap
    return -1;  // no overlap
}